

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<short,_true,_std::allocator<unsigned_long>_>::testInvariant
          (View<short,_true,_std::allocator<unsigned_long>_> *this)

{
  long lVar1;
  runtime_error *this_00;
  long lVar2;
  size_t j;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = *(long *)(this + 0x28);
  if (lVar1 == 0) {
    if (this[0x3c] == (View<short,_true,_std::allocator<unsigned_long>_>)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else {
      if (*(long *)this == 0) {
        return;
      }
      if (*(long *)(this + 0x30) == 1) {
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
  }
  else if (*(long *)this == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    lVar5 = *(long *)(this + 0x10);
    lVar2 = 1;
    lVar3 = 0;
    do {
      lVar2 = lVar2 * *(long *)(lVar5 + lVar3 * 8);
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
    if (*(long *)(this + 0x30) == lVar2) {
      lVar2 = *(long *)(this + 0x18);
      lVar4 = 1;
      lVar3 = lVar1;
      if (*(int *)(this + 0x38) == 0) {
        do {
          if (*(long *)(lVar2 + -8 + lVar3 * 8) != lVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0021e1b1;
          }
          lVar4 = lVar4 * *(long *)(lVar5 + -8 + lVar3 * 8);
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      else {
        lVar3 = 0;
        do {
          if (*(long *)(lVar2 + lVar3 * 8) != lVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0021e1b1;
          }
          lVar4 = lVar4 * *(long *)(lVar5 + lVar3 * 8);
          lVar3 = lVar3 + 1;
        } while (lVar1 != lVar3);
      }
      if (this[0x3c] == (View<short,_true,_std::allocator<unsigned_long>_>)0x1) {
        lVar5 = 0;
        do {
          if (*(long *)(*(long *)(this + 0x20) + lVar5 * 8) != *(long *)(lVar2 + lVar5 * 8)) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0021e1b1;
          }
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_0021e1b1:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline const std::size_t 
Geometry<A>::dimension() const
{
    return dimension_; 
}